

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *g;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  
  if ((flags & 0x300U) != 0) {
    __assert_fail("(flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x1c7b,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
  }
  pIVar2 = GImGui->HoveredWindow;
  if (pIVar2 == (ImGuiWindow *)0x0) {
    return false;
  }
  if ((flags & 4U) == 0) {
    pIVar3 = GImGui->CurrentWindow;
    if (pIVar3 == (ImGuiWindow *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x1c84,"bool ImGui::IsWindowHovered(ImGuiHoveredFlags)");
    }
    if ((flags & 2U) != 0) {
      pIVar3 = pIVar3->RootWindow;
      if ((flags & 8U) == 0) {
        pIVar3 = pIVar3->RootWindowPopupTree;
      }
      if ((flags & 0x10U) != 0) {
        pIVar3 = pIVar3->RootWindowDockTree;
      }
    }
    if ((flags & 1U) == 0) {
      if (pIVar2 != pIVar3) {
        return false;
      }
    }
    else {
      pIVar4 = pIVar2->RootWindow;
      if ((flags & 8U) == 0) {
        pIVar4 = pIVar4->RootWindowPopupTree;
      }
      if ((flags & 0x10U) != 0) {
        pIVar4 = pIVar4->RootWindowDockTree;
      }
      pIVar5 = pIVar2;
      if (pIVar4 != pIVar3) {
        while (pIVar5 != pIVar3) {
          if (pIVar5 == pIVar4) {
            return false;
          }
          ppIVar1 = &pIVar5->ParentWindow;
          pIVar5 = *ppIVar1;
          if (*ppIVar1 == (ImGuiWindow *)0x0) {
            return false;
          }
        }
      }
    }
  }
  if (((((((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
          (pIVar3 = GImGui->NavWindow->RootWindowDockTree, pIVar3 == (ImGuiWindow *)0x0)) ||
         (pIVar3->WasActive != true)) || (pIVar3 == pIVar2->RootWindowDockTree)) ||
       ((((uint)pIVar3->Flags >> 0x1b & 1) == 0 &&
        (((flags & 0x20U) != 0 || ((pIVar3->Flags & 0x4000000U) == 0)))))) &&
      ((pIVar2->Viewport == GImGui->MouseViewport ||
       ((GImGui->MovingWindow != (ImGuiWindow *)0x0 &&
        (pIVar2->RootWindowDockTree == GImGui->MovingWindow->RootWindowDockTree)))))) &&
     (((char)flags < '\0' ||
      (((GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap != false)) ||
       (GImGui->ActiveId == pIVar2->MoveId)))))) {
    return true;
  }
  return false;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        const bool dock_hierarchy = (flags & ImGuiHoveredFlags_DockHierarchy) != 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}